

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O0

void Omega_h::transfer_length
               (Mesh *old_mesh,Mesh *new_mesh,LOs *same_ents2old_ents,LOs *same_ents2new_ents,
               LOs *prods2new_ents)

{
  void *tagbase_00;
  bool bVar1;
  Int IVar2;
  int iVar3;
  string *__lhs;
  Read<double> local_b0;
  Read<int> local_a0;
  Read<int> local_90;
  Read<int> local_80 [2];
  Read<int> local_60;
  undefined1 local_50 [8];
  Reals prod_data;
  TagBase *tagbase;
  Int i;
  LOs *prods2new_ents_local;
  LOs *same_ents2new_ents_local;
  LOs *same_ents2old_ents_local;
  Mesh *new_mesh_local;
  Mesh *old_mesh_local;
  
  for (tagbase._4_4_ = 0; IVar2 = Mesh::ntags(old_mesh,1), tagbase._4_4_ < IVar2;
      tagbase._4_4_ = tagbase._4_4_ + 1) {
    prod_data.write_.shared_alloc_.direct_ptr = Mesh::get_tag(old_mesh,1,tagbase._4_4_);
    __lhs = TagBase::name_abi_cxx11_((TagBase *)prod_data.write_.shared_alloc_.direct_ptr);
    bVar1 = std::operator==(__lhs,"length");
    if (((bVar1) &&
        (iVar3 = (**(code **)(*prod_data.write_.shared_alloc_.direct_ptr + 0x10))(), iVar3 == 5)) &&
       (IVar2 = TagBase::ncomps((TagBase *)prod_data.write_.shared_alloc_.direct_ptr), IVar2 == 1))
    {
      Read<int>::Read(&local_60,prods2new_ents);
      measure_edges_metric((Omega_h *)local_50,new_mesh,&local_60);
      Read<int>::~Read(&local_60);
      Read<int>::Read(local_80,same_ents2old_ents);
      Read<int>::Read(&local_90,same_ents2new_ents);
      Read<int>::Read(&local_a0,prods2new_ents);
      tagbase_00 = prod_data.write_.shared_alloc_.direct_ptr;
      Read<double>::Read(&local_b0,(Read<double> *)local_50);
      transfer_common<double>
                (old_mesh,new_mesh,1,local_80,&local_90,&local_a0,(TagBase *)tagbase_00,&local_b0);
      Read<double>::~Read(&local_b0);
      Read<int>::~Read(&local_a0);
      Read<int>::~Read(&local_90);
      Read<int>::~Read(local_80);
      Read<double>::~Read((Read<double> *)local_50);
    }
  }
  return;
}

Assistant:

void transfer_length(Mesh* old_mesh, Mesh* new_mesh, LOs same_ents2old_ents,
    LOs same_ents2new_ents, LOs prods2new_ents) {
  for (Int i = 0; i < old_mesh->ntags(EDGE); ++i) {
    auto tagbase = old_mesh->get_tag(EDGE, i);
    if (tagbase->name() == "length" && tagbase->type() == OMEGA_H_REAL &&
        tagbase->ncomps() == 1) {
      auto prod_data = measure_edges_metric(new_mesh, prods2new_ents);
      transfer_common(old_mesh, new_mesh, EDGE, same_ents2old_ents,
          same_ents2new_ents, prods2new_ents, tagbase, prod_data);
    }
  }
}